

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O1

void CreateBackwardReferencesNH3
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  BrotliEncoderParams *pBVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 *puVar6;
  ushort uVar7;
  BrotliEncoderParams *pBVar8;
  uint uVar9;
  int iVar10;
  ulong *puVar11;
  ulong uVar12;
  ulong *puVar13;
  BrotliEncoderParams *pBVar14;
  byte bVar15;
  int iVar16;
  uint uVar17;
  ulong *puVar18;
  BrotliEncoderParams *pBVar19;
  undefined1 *puVar20;
  undefined1 *puVar21;
  BrotliEncoderParams *pBVar22;
  BrotliEncoderParams *pBVar23;
  BrotliEncoderParams *pBVar24;
  short sVar25;
  long lVar26;
  long lVar27;
  BrotliEncoderParams *pBVar28;
  char cVar29;
  ulong uVar30;
  BrotliEncoderParams *pBVar31;
  BrotliEncoderParams *pBVar32;
  ulong *puVar33;
  ulong *puVar34;
  uint uVar35;
  bool bVar36;
  ulong local_110;
  size_t *local_108;
  BrotliEncoderParams *local_100;
  BrotliEncoderParams *local_f8;
  ulong local_f0;
  ulong local_d8;
  ulong local_a8 [3];
  BrotliEncoderParams *local_90;
  long local_88;
  ulong local_80;
  ContextLut local_78;
  BrotliEncoderParams *local_70;
  BrotliEncoderParams *local_68;
  ulong local_60;
  long local_58;
  long local_50;
  BrotliEncoderParams *local_48;
  BrotliEncoderParams *local_40;
  long local_38;
  
  local_110 = *(ulong *)dist_cache;
  puVar2 = (undefined1 *)(position + num_bytes);
  local_48 = (BrotliEncoderParams *)((position - 7) + num_bytes);
  if (num_bytes < 8) {
    local_48 = (BrotliEncoderParams *)position;
  }
  local_88 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    local_88 = 0x40;
  }
  if ((undefined1 *)(position + 8) < puVar2) {
    pBVar31 = (BrotliEncoderParams *)((1L << (literal_context_lut[8] & 0x3f)) + -0x10);
    local_50 = *(long *)(literal_context_lut + 0x10);
    local_78 = literal_context_lut;
    local_58 = *(long *)(literal_context_lut + 0x60);
    pBVar28 = (BrotliEncoderParams *)(local_88 + position);
    pBVar3 = (BrotliEncoderParams *)(params->dictionary).compound.num_chunks;
    local_80 = ringbuffer_mask & 0xffffffff;
    local_60 = (ulong)(uint)((int)local_88 * 4);
    local_90 = (BrotliEncoderParams *)(puVar2 + -7);
    local_108 = last_insert_len;
    local_68 = (BrotliEncoderParams *)position;
    do {
      puVar20 = puVar2 + -(long)local_68;
      pBVar32 = pBVar31;
      if (local_68 < pBVar31) {
        pBVar32 = local_68;
      }
      uVar30 = (ulong)local_68 & ringbuffer_mask;
      puVar18 = (ulong *)(ringbuffer + uVar30);
      bVar15 = ringbuffer[uVar30];
      local_100 = (BrotliEncoderParams *)(long)*(int *)(hasher->common).extra;
      local_d8 = 0x7e4;
      local_80._0_4_ = (uint)ringbuffer_mask;
      if (((BrotliEncoderParams *)((long)local_68 - (long)local_100) < local_68) &&
         (uVar9 = (uint)(BrotliEncoderParams *)((long)local_68 - (long)local_100) & (uint)local_80,
         bVar15 == ringbuffer[uVar9])) {
        puVar11 = (ulong *)(ringbuffer + uVar9);
        puVar34 = puVar18;
        puVar33 = puVar11;
        for (puVar1 = puVar20; (undefined1 *)0x7 < puVar1; puVar1 = puVar1 + -8) {
          uVar12 = *puVar34;
          uVar4 = *puVar33;
          if (uVar12 == uVar4) {
            puVar33 = puVar33 + 1;
          }
          else {
            uVar5 = 0;
            if ((uVar4 ^ uVar12) != 0) {
              for (; ((uVar4 ^ uVar12) >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
              }
            }
            params = (BrotliEncoderParams *)
                     ((long)puVar33 + ((uVar5 >> 3 & 0x1fffffff) - (long)puVar11));
          }
          if (uVar12 != uVar4) goto LAB_01c16615;
          puVar34 = puVar34 + 1;
        }
        if (puVar1 != (undefined1 *)0x0) {
          puVar21 = (undefined1 *)0x0;
          do {
            puVar6 = puVar21;
            if (*(char *)((long)puVar33 + (long)puVar21) != *(char *)((long)puVar34 + (long)puVar21)
               ) break;
            puVar21 = puVar21 + 1;
            puVar6 = puVar1;
          } while (puVar1 != puVar21);
          puVar33 = (ulong *)((long)puVar33 + (long)puVar6);
        }
        params = (BrotliEncoderParams *)((long)puVar33 - (long)puVar11);
LAB_01c16615:
        if ((params < (BrotliEncoderParams *)0x4) ||
           (uVar12 = (long)params * 0x87 + 0x78f, uVar12 < 0x7e5)) goto LAB_01c1663e;
        bVar15 = *(byte *)((long)puVar18 + (long)params);
        local_d8 = uVar12;
      }
      else {
LAB_01c1663e:
        local_100 = (BrotliEncoderParams *)0x0;
        params = (BrotliEncoderParams *)0x0;
      }
      uVar9 = (uint)(ushort)((ulong)(*(long *)(ringbuffer + uVar30) * 0x7bd3579bd3000000) >> 0x30);
      local_a8[0] = (ulong)uVar9;
      local_a8[1] = (ulong)uVar9 + 8 & 0xffff;
      pBVar23 = (BrotliEncoderParams *)(ulong)bVar15;
      pBVar19 = (BrotliEncoderParams *)0x0;
      do {
        uVar9 = *(uint *)((long)(pBVar3->dictionary).compound.chunks +
                         local_a8[(long)pBVar19] * 4 + -0x68);
        puVar34 = (ulong *)(ringbuffer + ((uint)local_80 & uVar9));
        if ((((uint)pBVar23 ==
              (uint)*(byte *)((long)puVar34 + (long)(&params->dictionary + -1) + 0x4d8)) &&
            (local_68 != (BrotliEncoderParams *)(ulong)uVar9)) &&
           (pBVar22 = (BrotliEncoderParams *)((long)local_68 - (long)(ulong)uVar9), puVar1 = puVar20
           , puVar33 = puVar18, puVar11 = puVar34, pBVar14 = local_68, pBVar22 <= pBVar32)) {
          for (; (undefined1 *)0x7 < puVar1; puVar1 = puVar1 + -8) {
            uVar30 = *puVar33;
            uVar12 = *puVar11;
            if (uVar30 == uVar12) {
              puVar11 = puVar11 + 1;
            }
            else {
              uVar4 = 0;
              if ((uVar12 ^ uVar30) != 0) {
                for (; ((uVar12 ^ uVar30) >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                }
              }
              pBVar14 = (BrotliEncoderParams *)
                        ((long)puVar11 + ((uVar4 >> 3 & 0x1fffffff) - (long)puVar34));
            }
            if (uVar30 != uVar12) goto LAB_01c16750;
            puVar33 = puVar33 + 1;
          }
          puVar13 = puVar11;
          if (puVar1 != (undefined1 *)0x0) {
            puVar13 = (ulong *)((long)puVar11 + (long)puVar1);
            lVar26 = 0;
            do {
              if (*(char *)((long)puVar11 + lVar26) != *(char *)((long)puVar33 + lVar26)) {
                puVar13 = (ulong *)((long)puVar11 + lVar26);
                break;
              }
              lVar26 = lVar26 + 1;
            } while (puVar1 != (undefined1 *)lVar26);
          }
          pBVar14 = (BrotliEncoderParams *)((long)puVar13 - (long)puVar34);
LAB_01c16750:
          if ((BrotliEncoderParams *)0x3 < pBVar14) {
            iVar10 = 0x1f;
            if ((uint)pBVar22 != 0) {
              for (; (uint)pBVar22 >> iVar10 == 0; iVar10 = iVar10 + -1) {
              }
            }
            uVar30 = (ulong)(iVar10 * -0x1e + 0x780) + (long)pBVar14 * 0x87;
            if (local_d8 < uVar30) {
              pBVar23 = (BrotliEncoderParams *)(ulong)*(byte *)((long)puVar18 + (long)pBVar14);
              params = pBVar14;
              local_100 = pBVar22;
              local_d8 = uVar30;
            }
          }
        }
        pBVar14 = (BrotliEncoderParams *)((long)&pBVar19->mode + 1);
        bVar36 = pBVar19 == (BrotliEncoderParams *)0x0;
        pBVar19 = pBVar14;
      } while (bVar36);
      *(uint *)((long)(pBVar3->dictionary).compound.chunks +
               *(long *)((long)local_a8 + (ulong)((uint)local_68 & 8)) * 4 + -0x68) = (uint)local_68
      ;
      if (local_d8 < 0x7e5) {
        local_110 = local_110 + 1;
        position = (long)&local_68->mode + 1;
        if (pBVar28 < position) {
          if ((BrotliEncoderParams *)
              ((long)(pBVar28->dictionary).compound.chunks + (local_60 - 0x68)) < position) {
            pBVar32 = (BrotliEncoderParams *)((long)&local_68->stream_offset + 1);
            if (local_90 <= pBVar32) {
              pBVar32 = local_90;
            }
            for (; position < pBVar32;
                position = (size_t)&((BrotliEncoderParams *)position)->quality) {
              *(uint *)((long)(pBVar3->dictionary).compound.chunks +
                       (ulong)((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                               (position & ringbuffer_mask)) *
                                                     0x7bd3579bd3000000) >> 0x30) +
                               ((uint)position & 8) & 0xffff) * 4 + -0x68) = (uint)position;
              local_110 = local_110 + 4;
            }
          }
          else {
            pBVar32 = (BrotliEncoderParams *)((long)&local_68->lgwin + 1);
            if (local_90 <= pBVar32) {
              pBVar32 = local_90;
            }
            for (; position < pBVar32; position = (long)&((BrotliEncoderParams *)position)->mode + 2
                ) {
              *(uint *)((long)(pBVar3->dictionary).compound.chunks +
                       (ulong)((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                               (position & ringbuffer_mask)) *
                                                     0x7bd3579bd3000000) >> 0x30) +
                               ((uint)position & 8) & 0xffff) * 4 + -0x68) = (uint)position;
              local_110 = local_110 + 2;
            }
          }
        }
      }
      else {
        local_70 = (BrotliEncoderParams *)(long)*(int *)(hasher->common).extra;
        iVar10 = 0;
        do {
          puVar20 = puVar20 + -1;
          local_40 = params;
          pBVar28 = (BrotliEncoderParams *)&params[-1].dictionary.field_0x527;
          if (puVar20 <= pBVar28) {
            pBVar28 = (BrotliEncoderParams *)puVar20;
          }
          if (4 < *(int *)(literal_context_lut + 4)) {
            pBVar28 = (BrotliEncoderParams *)0x0;
          }
          pBVar32 = (BrotliEncoderParams *)((long)&local_68->mode + 1);
          pBVar19 = pBVar31;
          if (pBVar32 < pBVar31) {
            pBVar19 = pBVar32;
          }
          pBVar22 = (BrotliEncoderParams *)(ringbuffer + ((ulong)pBVar32 & ringbuffer_mask));
          cVar29 = *(char *)((long)(pBVar22->dictionary).contextual.dict +
                            (long)(pBVar28[-1].dictionary.contextual.dict + 1));
          local_f0 = 0x7e4;
          if (((BrotliEncoderParams *)((long)pBVar32 - (long)local_70) < pBVar32) &&
             (puVar34 = (ulong *)(ringbuffer +
                                 ((uint)(BrotliEncoderParams *)((long)pBVar32 - (long)local_70) &
                                 (uint)local_80)), puVar1 = puVar20, pBVar8 = pBVar22,
             puVar18 = puVar34,
             cVar29 == *(char *)((long)puVar34 + (long)(&pBVar28->dictionary + -1) + 0x4d8))) {
            for (; pBVar14 = pBVar8, (undefined1 *)0x7 < puVar1; puVar1 = puVar1 + -8) {
              uVar30._0_4_ = pBVar14->mode;
              uVar30._4_4_ = pBVar14->quality;
              uVar12 = *puVar18;
              if (uVar30 == uVar12) {
                puVar18 = puVar18 + 1;
              }
              else {
                uVar4 = 0;
                if ((uVar12 ^ uVar30) != 0) {
                  for (; ((uVar12 ^ uVar30) >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                  }
                }
                pBVar23 = (BrotliEncoderParams *)
                          ((long)puVar18 + ((uVar4 >> 3 & 0x1fffffff) - (long)puVar34));
              }
              if (uVar30 != uVar12) goto LAB_01c168f2;
              pBVar8 = (BrotliEncoderParams *)&pBVar14->lgwin;
            }
            puVar33 = puVar18;
            if (puVar1 != (undefined1 *)0x0) {
              puVar33 = (ulong *)((long)puVar18 + (long)puVar1);
              lVar26 = 0;
              do {
                if (*(char *)((long)puVar18 + lVar26) !=
                    *(char *)((long)(pBVar14->dictionary).compound.chunks + lVar26 + -0x68)) {
                  puVar33 = (ulong *)((long)puVar18 + lVar26);
                  break;
                }
                lVar26 = lVar26 + 1;
              } while (puVar1 != (undefined1 *)lVar26);
            }
            pBVar23 = (BrotliEncoderParams *)((long)puVar33 - (long)puVar34);
LAB_01c168f2:
            if ((pBVar23 < (BrotliEncoderParams *)0x4) ||
               (uVar30 = (long)pBVar23 * 0x87 + 0x78f, uVar30 < 0x7e5)) {
              local_f8 = (BrotliEncoderParams *)0x0;
            }
            else {
              cVar29 = *(char *)((long)(pBVar23->dictionary).contextual.dict +
                                (long)(pBVar22[-1].dictionary.contextual.dict + 1));
              pBVar28 = pBVar23;
              local_f8 = local_70;
              local_f0 = uVar30;
            }
          }
          else {
            local_f8 = (BrotliEncoderParams *)0x0;
          }
          uVar9 = (uint)(ushort)((ulong)(*(long *)(ringbuffer + ((ulong)pBVar32 & ringbuffer_mask))
                                        * 0x7bd3579bd3000000) >> 0x30);
          local_a8[0] = (ulong)uVar9;
          local_a8[1] = (ulong)uVar9 + 8 & 0xffff;
          local_38 = *(long *)((long)local_a8 + (ulong)((uint)pBVar32 & 8));
          lVar26 = 0;
          do {
            uVar9 = *(uint *)((long)(pBVar3->dictionary).compound.chunks +
                             local_a8[lVar26] * 4 + -0x68);
            puVar18 = (ulong *)(ringbuffer + ((uint)local_80 & uVar9));
            if (((cVar29 == *(char *)((long)puVar18 + (long)(&pBVar28->dictionary + -1) + 0x4d8)) &&
                (pBVar32 != (BrotliEncoderParams *)(ulong)uVar9)) &&
               (pBVar24 = (BrotliEncoderParams *)((long)pBVar32 - (long)(ulong)uVar9),
               puVar1 = puVar20, pBVar8 = pBVar22, puVar34 = puVar18, pBVar24 <= pBVar19)) {
              for (; pBVar23 = pBVar8, (undefined1 *)0x7 < puVar1; puVar1 = puVar1 + -8) {
                uVar12._0_4_ = pBVar23->mode;
                uVar12._4_4_ = pBVar23->quality;
                uVar30 = *puVar34;
                if (uVar12 == uVar30) {
                  puVar34 = puVar34 + 1;
                }
                else {
                  uVar4 = 0;
                  if ((uVar30 ^ uVar12) != 0) {
                    for (; ((uVar30 ^ uVar12) >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                    }
                  }
                  pBVar14 = (BrotliEncoderParams *)
                            ((long)puVar34 + ((uVar4 >> 3 & 0x1fffffff) - (long)puVar18));
                }
                if (uVar12 != uVar30) goto LAB_01c16a2e;
                pBVar8 = (BrotliEncoderParams *)&pBVar23->lgwin;
              }
              puVar33 = puVar34;
              if (puVar1 != (undefined1 *)0x0) {
                puVar33 = (ulong *)((long)puVar34 + (long)puVar1);
                lVar27 = 0;
                do {
                  if (*(char *)((long)puVar34 + lVar27) !=
                      *(char *)((long)(pBVar23->dictionary).compound.chunks + lVar27 + -0x68)) {
                    puVar33 = (ulong *)((long)puVar34 + lVar27);
                    break;
                  }
                  lVar27 = lVar27 + 1;
                } while (puVar1 != (undefined1 *)lVar27);
              }
              pBVar14 = (BrotliEncoderParams *)((long)puVar33 - (long)puVar18);
LAB_01c16a2e:
              if ((BrotliEncoderParams *)0x3 < pBVar14) {
                iVar16 = 0x1f;
                if ((uint)pBVar24 != 0) {
                  for (; (uint)pBVar24 >> iVar16 == 0; iVar16 = iVar16 + -1) {
                  }
                }
                uVar30 = (ulong)(iVar16 * -0x1e + 0x780) + (long)pBVar14 * 0x87;
                if (local_f0 < uVar30) {
                  cVar29 = *(char *)((long)(pBVar14->dictionary).contextual.dict +
                                    (long)(pBVar22[-1].dictionary.contextual.dict + 1));
                  pBVar28 = pBVar14;
                  local_f8 = pBVar24;
                  local_f0 = uVar30;
                }
              }
            }
            bVar36 = lVar26 == 0;
            lVar26 = lVar26 + 1;
          } while (bVar36);
          *(uint *)((long)(pBVar3->dictionary).compound.chunks + local_38 * 4 + -0x68) =
               (uint)pBVar32;
          if (local_f0 < local_d8 + 0xaf) {
            bVar36 = false;
            pBVar28 = params;
            pBVar32 = local_68;
            iVar16 = iVar10;
          }
          else {
            local_110 = local_110 + 1;
            iVar16 = iVar10 + 1;
            bVar36 = iVar10 < 3 && (undefined1 *)((long)&local_68->lgwin + 1U) < puVar2;
            local_d8 = local_f0;
            local_100 = local_f8;
          }
          params = pBVar28;
          local_68 = pBVar32;
          iVar10 = iVar16;
        } while (bVar36);
        pBVar23 = (BrotliEncoderParams *)
                  ((long)(pBVar32->dictionary).compound.chunks + local_50 + -0x68);
        if (pBVar31 <= pBVar23) {
          pBVar23 = pBVar31;
        }
        pBVar23 = (BrotliEncoderParams *)
                  ((long)(pBVar23->dictionary).compound.chunks + local_58 + -0x68);
        if (pBVar23 < local_100) {
LAB_01c16c7a:
          puVar20 = (undefined1 *)((long)&local_100->lgblock + 3);
        }
        else {
          pBVar19 = (BrotliEncoderParams *)(long)*(int *)(hasher->common).extra;
          uVar9 = 0;
          bVar36 = false;
          if (local_100 != pBVar19) {
            pBVar14 = (BrotliEncoderParams *)(long)*(int *)((long)(hasher->common).extra + 4);
            if (local_100 == pBVar14) {
              uVar9 = 1;
LAB_01c16b65:
              bVar36 = false;
            }
            else {
              uVar30 = (long)local_100 + (3 - (long)pBVar19);
              if (uVar30 < 7) {
                iVar10 = (int)uVar30;
                uVar9 = 0x9750468;
              }
              else {
                uVar30 = (long)local_100 + (3 - (long)pBVar14);
                if (6 < uVar30) {
                  if (local_100 != (BrotliEncoderParams *)(long)*(int *)((hasher->common).extra + 1)
                     ) {
                    bVar36 = local_100 !=
                             (BrotliEncoderParams *)
                             (long)*(int *)((long)(hasher->common).extra + 0xc);
                    uVar9 = 3;
                    goto LAB_01c16c76;
                  }
                  uVar9 = 2;
                  goto LAB_01c16b65;
                }
                iVar10 = (int)uVar30;
                uVar9 = 0xfdb1ace;
              }
              uVar9 = uVar9 >> ((byte)(iVar10 << 2) & 0x1f) & 0xf;
              bVar36 = false;
            }
          }
LAB_01c16c76:
          if (bVar36) goto LAB_01c16c7a;
          puVar20 = (undefined1 *)(ulong)uVar9;
        }
        if ((local_100 <= pBVar23) && (puVar20 != (undefined1 *)0x0)) {
          *(undefined4 *)((long)(hasher->common).extra + 0xc) =
               *(undefined4 *)((hasher->common).extra + 1);
          *(void **)((long)(hasher->common).extra + 4) = (hasher->common).extra[0];
          *(int *)(hasher->common).extra = (int)local_100;
        }
        uVar9 = (uint)local_110;
        *(uint *)local_108 = uVar9;
        uVar35 = (uint)pBVar28;
        *(uint *)((long)local_108 + 4) = uVar35;
        puVar1 = (undefined1 *)((ulong)*(uint *)(literal_context_lut + 0x3c) + 0x10);
        if (puVar20 < puVar1) {
          *(short *)((long)local_108 + 0xe) = (short)puVar20;
          uVar17 = 0;
        }
        else {
          bVar15 = (byte)*(int *)(literal_context_lut + 0x38);
          puVar20 = puVar20 + ((4L << (bVar15 & 0x3f)) -
                              (ulong)*(uint *)(literal_context_lut + 0x3c)) + -0x10;
          uVar17 = 0x1f;
          if ((uint)puVar20 != 0) {
            for (; (uint)puVar20 >> uVar17 == 0; uVar17 = uVar17 - 1) {
            }
          }
          uVar17 = (uVar17 ^ 0xffffffe0) + 0x1f;
          bVar36 = ((ulong)puVar20 >> ((ulong)uVar17 & 0x3f) & 1) != 0;
          iVar10 = uVar17 - *(int *)(literal_context_lut + 0x38);
          *(ushort *)((long)local_108 + 0xe) =
               (short)((uint)bVar36 + iVar10 * 2 + 0xfffe << (bVar15 & 0x3f)) +
               (short)puVar1 + (~(ushort)(-1 << (bVar15 & 0x1f)) & (ushort)puVar20) |
               (short)iVar10 * 0x400;
          uVar17 = (uint)((long)puVar20 - ((ulong)bVar36 + 2 << ((byte)uVar17 & 0x3f)) >>
                         (bVar15 & 0x3f));
        }
        *(uint *)(local_108 + 1) = uVar17;
        if (5 < local_110) {
          if (local_110 < 0x82) {
            uVar9 = 0x1f;
            uVar17 = (uint)(local_110 - 2);
            if (uVar17 != 0) {
              for (; uVar17 >> uVar9 == 0; uVar9 = uVar9 - 1) {
              }
            }
            uVar9 = (int)(local_110 - 2 >> ((char)(uVar9 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                    (uVar9 ^ 0xffffffe0) * 2 + 0x40;
          }
          else if (local_110 < 0x842) {
            uVar17 = 0x1f;
            if (uVar9 - 0x42 != 0) {
              for (; uVar9 - 0x42 >> uVar17 == 0; uVar17 = uVar17 - 1) {
              }
            }
            uVar9 = (uVar17 ^ 0xffe0) + 0x2a;
          }
          else {
            uVar9 = 0x15;
            if (0x1841 < local_110) {
              uVar9 = (uint)(ushort)(0x17 - (local_110 < 0x5842));
            }
          }
        }
        uVar30 = (ulong)(int)uVar35;
        if (uVar30 < 10) {
          uVar17 = uVar35 - 2;
        }
        else if (uVar30 < 0x86) {
          uVar35 = 0x1f;
          uVar17 = (uint)(uVar30 - 6);
          if (uVar17 != 0) {
            for (; uVar17 >> uVar35 == 0; uVar35 = uVar35 - 1) {
            }
          }
          uVar17 = (int)(uVar30 - 6 >> ((char)(uVar35 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                   (uVar35 ^ 0xffffffe0) * 2 + 0x42;
        }
        else {
          uVar17 = 0x17;
          if (uVar30 < 0x846) {
            uVar17 = 0x1f;
            if (uVar35 - 0x46 != 0) {
              for (; uVar35 - 0x46 >> uVar17 == 0; uVar17 = uVar17 - 1) {
              }
            }
            uVar17 = (uVar17 ^ 0xffe0) + 0x2c;
          }
        }
        uVar7 = (ushort)uVar17;
        sVar25 = (uVar7 & 7) + ((ushort)uVar9 & 7) * 8;
        if ((((*(ushort *)((long)local_108 + 0xe) & 0x3ff) == 0) && ((ushort)uVar9 < 8)) &&
           (uVar7 < 0x10)) {
          if (7 < uVar7) {
            sVar25 = sVar25 + 0x40;
          }
        }
        else {
          iVar10 = ((uVar9 & 0xffff) >> 3) * 3 + ((uVar17 & 0xffff) >> 3);
          sVar25 = sVar25 + ((ushort)(0x520d40 >> ((char)iVar10 * '\x02' & 0x1fU)) & 0xc0) +
                            (short)iVar10 * 0x40 + 0x40;
        }
        *(short *)((long)local_108 + 0xc) = sVar25;
        *num_commands = *num_commands + local_110;
        position = (long)(pBVar28->dictionary).contextual.dict +
                   (long)(pBVar32[-1].dictionary.contextual.dict + 1);
        pBVar23 = local_48;
        if (position < local_48) {
          pBVar23 = (BrotliEncoderParams *)position;
        }
        pBVar19 = (BrotliEncoderParams *)((long)&pBVar32->mode + 2);
        params = local_100;
        if (local_100 < (BrotliEncoderParams *)((ulong)pBVar28 >> 2)) {
          params = (BrotliEncoderParams *)((long)local_100 * 4);
          pBVar14 = (BrotliEncoderParams *)(position + (long)local_100 * -4);
          if (pBVar14 < pBVar19) {
            pBVar14 = pBVar19;
          }
          pBVar19 = pBVar14;
          if (pBVar23 < pBVar14) {
            pBVar19 = pBVar23;
          }
        }
        pBVar28 = (BrotliEncoderParams *)
                  ((long)(pBVar32->dictionary).compound.chunks +
                  local_88 + (long)pBVar28 * 2 + -0x68);
        local_108 = local_108 + 2;
        if (pBVar19 < pBVar23) {
          do {
            *(uint *)((long)(pBVar3->dictionary).compound.chunks +
                     (ulong)((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                             ((ulong)pBVar19 & ringbuffer_mask)) *
                                                   0x7bd3579bd3000000) >> 0x30) +
                             ((uint)pBVar19 & 8) & 0xffff) * 4 + -0x68) = (uint)pBVar19;
            pBVar19 = (BrotliEncoderParams *)((long)&pBVar19->mode + 1);
            params = pBVar3;
          } while (pBVar23 != pBVar19);
        }
        local_110 = 0;
      }
      local_68 = (BrotliEncoderParams *)position;
    } while (&((BrotliEncoderParams *)position)->lgwin < puVar2);
  }
  else {
    local_108 = last_insert_len;
  }
  *(undefined1 **)dist_cache = puVar2 + (local_110 - position);
  *(long *)commands = *(long *)commands + ((long)local_108 - (long)last_insert_len >> 4);
  return;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}